

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnLoopExpr(BinaryReaderIR *this,Type sig_type)

{
  bool bVar1;
  pointer pBVar2;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_50;
  Enum local_44;
  ExprList *local_40;
  ExprList *expr_list;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
  local_28;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
  expr;
  Type sig_type_local;
  BinaryReaderIR *this_local;
  
  expr._M_t.
  super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)22>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
  .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)22>_*,_false>._M_head_impl._4_4_ =
       sig_type;
  MakeUnique<wabt::BlockExprBase<(wabt::ExprType)22>>();
  pBVar2 = std::
           unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
           ::operator->(&local_28);
  SetBlockDeclaration(this,&(pBVar2->block).decl,
                      expr._M_t.
                      super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)22>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
                      .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)22>_*,_false>.
                      _M_head_impl._4_4_);
  pBVar2 = std::
           unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
           ::operator->(&local_28);
  local_40 = &(pBVar2->block).exprs;
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_50,&local_28);
  local_44 = (Enum)AppendExpr(this,&local_50);
  bVar1 = Failed((Result)local_44);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_50);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    PushLabel(this,Loop,local_40,(Expr *)0x0);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  std::
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
  ::~unique_ptr(&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnLoopExpr(Type sig_type) {
  auto expr = MakeUnique<LoopExpr>();
  SetBlockDeclaration(&expr->block.decl, sig_type);
  ExprList* expr_list = &expr->block.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  PushLabel(LabelType::Loop, expr_list);
  return Result::Ok;
}